

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_thunder.c
# Opt level: O0

int ThunderSetupDecode(TIFF *tif)

{
  bool bVar1;
  TIFF *tif_local;
  
  bVar1 = (tif->tif_dir).td_bitspersample == 4;
  if (!bVar1) {
    TIFFErrorExtR(tif,"ThunderSetupDecode",
                  "Wrong bitspersample value (%d), Thunder decoder only supports 4bits per sample.",
                  (ulong)(tif->tif_dir).td_bitspersample);
  }
  tif_local._4_4_ = (uint)bVar1;
  return tif_local._4_4_;
}

Assistant:

static int ThunderSetupDecode(TIFF *tif)
{
    static const char module[] = "ThunderSetupDecode";

    if (tif->tif_dir.td_bitspersample != 4)
    {
        TIFFErrorExtR(tif, module,
                      "Wrong bitspersample value (%d), Thunder decoder only "
                      "supports 4bits per sample.",
                      (int)tif->tif_dir.td_bitspersample);
        return 0;
    }

    return (1);
}